

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_send_text_binary_frame(void)

{
  uint uVar1;
  uint length;
  cio_websocket *websocket;
  _Bool _Var2;
  cio_error cVar3;
  void *__s;
  char *payload;
  size_t sVar4;
  cio_error err;
  cio_error err_2;
  cio_error err_1;
  uint32_t context;
  cio_write_buffer wb;
  cio_write_buffer wbh;
  ws_frame frames [1];
  char *check_data;
  char *data;
  uint32_t frame_size;
  frame_direction direction;
  uint k;
  uint j;
  uint i;
  frame_direction directions [2];
  uint frame_types [2];
  uint32_t frame_sizes [6];
  
  frame_types[0] = 1;
  frame_types[1] = 5;
  directions[0] = 2;
  directions[1] = FROM_SERVER;
  _j = 0x100000000;
  k = 0;
  do {
    if (5 < k) {
      return;
    }
    for (direction = FROM_CLIENT; direction < 2; direction = direction + FROM_SERVER) {
      for (frame_size = 0; frame_size < 2; frame_size = frame_size + 1) {
        uVar1 = (&j)[frame_size];
        length = frame_types[k];
        __s = malloc((ulong)length);
        if (__s == (void *)0x0) {
          UnityFail("Could not allocate memory for test frame!",0x9f1);
        }
        memset(__s,0x61,(ulong)length);
        payload = (char *)malloc((ulong)length);
        if (payload == (char *)0x0) {
          UnityFail("Could not allocate memory for check frame!",0x9f6);
        }
        memcpy(payload,__s,(ulong)length);
        wbh.data.element.length._0_4_ = 8;
        wbh.data.element.length._4_4_ = uVar1;
        serialize_frames((ws_frame *)((long)&wbh.data + 8),1);
        cio_write_buffer_head_init((cio_write_buffer *)((long)&wb.data + 8));
        cio_write_buffer_element_init((cio_write_buffer *)&err_1,__s,(ulong)length);
        cio_write_buffer_queue_tail
                  ((cio_write_buffer *)((long)&wb.data + 8),(cio_write_buffer *)&err_1);
        *(ushort *)&(ws->ws_private).ws_flags =
             *(ushort *)&(ws->ws_private).ws_flags & 0xfbff |
             (ushort)(wbh.data.element.length._4_4_ == 0) << 10;
        websocket = ws;
        err_2 = 0x1234568;
        if (directions[direction] == FROM_SERVER) {
          sVar4 = cio_write_buffer_get_total_size((cio_write_buffer *)((long)&wb.data + 8));
          cVar3 = cio_websocket_write_message_first_chunk
                            (websocket,sVar4,(cio_write_buffer *)((long)&wb.data + 8),true,false,
                             write_handler,&err_2);
          UnityAssertEqualNumber
                    (0,(long)cVar3,"Writing a text frame did not succeed!",0xa0b,
                     UNITY_DISPLAY_STYLE_INT);
          _Var2 = check_frame(CIO_WEBSOCKET_TEXT_FRAME,payload,(ulong)length,true);
          if (!_Var2) {
            UnityFail("First frame send is incorrect text frame!",0xa0c);
          }
        }
        else if (directions[direction] == 2) {
          sVar4 = cio_write_buffer_get_total_size((cio_write_buffer *)((long)&wb.data + 8));
          cVar3 = cio_websocket_write_message_first_chunk
                            (websocket,sVar4,(cio_write_buffer *)((long)&wb.data + 8),true,true,
                             write_handler,&err_2);
          UnityAssertEqualNumber
                    (0,(long)cVar3,"Writing a binary frame did not succeed!",0xa0f,
                     UNITY_DISPLAY_STYLE_INT);
          _Var2 = check_frame(CIO_WEBSOCKET_BINARY_FRAME,payload,(ulong)length,true);
          if (!_Var2) {
            UnityFail("First frame send is incorrect binary frame!",0xa10);
          }
        }
        cVar3 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
        UnityAssertEqualNumber
                  (0,(long)cVar3,"Could not start reading a message!",0xa14,UNITY_DISPLAY_STYLE_INT)
        ;
        _Var2 = is_close_frame(1000,true);
        if (!_Var2) {
          UnityFail("written frame is not a close frame!",0xa15);
        }
        UnityAssertEqualNumber
                  (1,(ulong)write_handler_fake.call_count,"write handler was not called!",0xa17,
                   UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_val,
                   "websocket pointer in write handler not correct!",0xa18,UNITY_DISPLAY_STYLE_HEX64
                  );
        UnityAssertEqualNumber
                  ((UNITY_INT)&err_2,(UNITY_INT)write_handler_fake.arg1_val,
                   "context pointer in write handler not correct!",0xa19,UNITY_DISPLAY_STYLE_HEX64);
        UnityAssertEqualNumber
                  (0,(long)write_handler_fake.arg2_val,"error code in write handler not correct!",
                   0xa1a,UNITY_DISPLAY_STYLE_INT);
        sVar4 = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)((long)&wb.data + 8));
        UnityAssertEqualNumber
                  (1,sVar4,"Length of write buffer different than before writing!",0xa1c,
                   UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  ((UNITY_INT)((long)&wb.data + 8),*(UNITY_INT *)wb.data.element.length,
                   "Concatenation of write buffers no longer correct after writing!",0xa1d,
                   UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualMemory
                  (__s,*(void **)(wb.data.element.length + 0x10),length,1,
                   "Content of writebuffer not correct after writing!",0xa1e,UNITY_ARRAY_TO_ARRAY);
        UnityAssertEqualNumber
                  (0,(ulong)on_error_fake.call_count,"error callback was called",0xa20,
                   UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  (1,(ulong)on_control_fake.call_count,
                   "control callback was called not for last close frame",0xa21,
                   UNITY_DISPLAY_STYLE_INT);
        if (__s != (void *)0x0) {
          free(__s);
        }
        if (payload != (char *)0x0) {
          free(payload);
        }
        free(ws);
        setUp();
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

static void test_send_text_binary_frame(void)
{
	uint32_t frame_sizes[] = {1, 5, 125, 126, 65535, 65536};
	unsigned int frame_types[] = {CIO_WEBSOCKET_BINARY_FRAME, CIO_WEBSOCKET_TEXT_FRAME};
	enum frame_direction directions[] = {FROM_CLIENT, FROM_SERVER};

	for (unsigned int i = 0; i < ARRAY_SIZE(frame_sizes); i++) {
		for (unsigned int j = 0; j < ARRAY_SIZE(frame_types); j++) {
			for (unsigned int k = 0; k < ARRAY_SIZE(directions); k++) {
				enum frame_direction direction = directions[k];
				uint32_t frame_size = frame_sizes[i];
				char *data = malloc(frame_size);
				if (data == NULL) {
					TEST_FAIL_MESSAGE("Could not allocate memory for test frame!");
				}
				memset(data, 'a', frame_size);
				char *check_data = malloc(frame_size);
				if (check_data == NULL) {
					TEST_FAIL_MESSAGE("Could not allocate memory for check frame!");
				}
				memcpy(check_data, data, frame_size);

				struct ws_frame frames[] = {
				    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = direction, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
				};

				serialize_frames(frames, ARRAY_SIZE(frames));

				struct cio_write_buffer wbh;
				cio_write_buffer_head_init(&wbh);

				struct cio_write_buffer wb;
				cio_write_buffer_element_init(&wb, data, frame_size);
				cio_write_buffer_queue_tail(&wbh, &wb);

				ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
				uint32_t context = 0x1234568;
				if (frame_types[j] == CIO_WEBSOCKET_TEXT_FRAME) {
					enum cio_error err = cio_websocket_write_message_first_chunk(ws, cio_write_buffer_get_total_size(&wbh), &wbh, true, false, write_handler, &context);
					TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a text frame did not succeed!");
					TEST_ASSERT_MESSAGE(check_frame(CIO_WEBSOCKET_TEXT_FRAME, check_data, frame_size, true), "First frame send is incorrect text frame!");
				} else if (frame_types[j] == CIO_WEBSOCKET_BINARY_FRAME) {
					enum cio_error err = cio_websocket_write_message_first_chunk(ws, cio_write_buffer_get_total_size(&wbh), &wbh, true, true, write_handler, &context);
					TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a binary frame did not succeed!");
					TEST_ASSERT_MESSAGE(check_frame(CIO_WEBSOCKET_BINARY_FRAME, check_data, frame_size, true), "First frame send is incorrect binary frame!");
				}

				enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
				TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");
				TEST_ASSERT_MESSAGE(is_close_frame(CIO_WEBSOCKET_CLOSE_NORMAL, true), "written frame is not a close frame!");

				TEST_ASSERT_EQUAL_MESSAGE(1, write_handler_fake.call_count, "write handler was not called!");
				TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, write_handler_fake.arg0_val, "websocket pointer in write handler not correct!");
				TEST_ASSERT_EQUAL_PTR_MESSAGE(&context, write_handler_fake.arg1_val, "context pointer in write handler not correct!");
				TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, write_handler_fake.arg2_val, "error code in write handler not correct!");

				TEST_ASSERT_EQUAL_MESSAGE(1, cio_write_buffer_get_num_buffer_elements(&wbh), "Length of write buffer different than before writing!");
				TEST_ASSERT_EQUAL_MESSAGE(&wbh, wbh.next->next, "Concatenation of write buffers no longer correct after writing!");
				TEST_ASSERT_EQUAL_MEMORY_MESSAGE(data, wbh.next->data.element.data, frame_size, "Content of writebuffer not correct after writing!");

				TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");
				TEST_ASSERT_EQUAL_MESSAGE(1, on_control_fake.call_count, "control callback was called not for last close frame");

				if (data) {
					free(data);
				}

				if (check_data) {
					free(check_data);
				}

				free(ws);
				setUp();
			}
		}
	}
}